

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O1

float png_get_y_offset_inches(png_const_structrp png_ptr,png_const_inforp info_ptr)

{
  float fVar1;
  
  fVar1 = 0.0;
  if (((info_ptr != (png_const_inforp)0x0 && png_ptr != (png_const_structrp)0x0) &&
      (fVar1 = 0.0, (info_ptr->valid & 0x100) != 0)) && (info_ptr->offset_unit_type == '\x01')) {
    fVar1 = (float)info_ptr->y_offset * 3.937e-05;
  }
  return fVar1;
}

Assistant:

png_int_32 PNGAPI
png_get_y_offset_microns(png_const_structrp png_ptr, png_const_inforp info_ptr)
{
#ifdef PNG_oFFs_SUPPORTED
   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_oFFs) != 0)
   {
      png_debug1(1, "in %s retrieval function", "png_get_y_offset_microns");

      if (info_ptr->offset_unit_type == PNG_OFFSET_MICROMETER)
         return (info_ptr->y_offset);
   }
#else
   PNG_UNUSED(png_ptr)
   PNG_UNUSED(info_ptr)
#endif

   return (0);
}